

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_store.cc
# Opt level: O1

string * rcg::storeImage(string *__return_storage_ptr__,string *name,ImgFmt fmt,Image *image,
                        size_t yoffset,size_t height)

{
  ulong uVar1;
  _Head_base<0UL,_unsigned_char_*,_false> _Var2;
  uint64_t pixelformat;
  pointer pcVar3;
  bool bVar4;
  ulong height_00;
  ulong uVar5;
  uint8_t *puVar6;
  ostream *poVar7;
  IOException *this;
  long *plVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  ulong uVar10;
  undefined1 auVar11 [8];
  uint8_t *puVar12;
  size_t sVar13;
  size_t sVar14;
  int j;
  long lVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  ofstream out;
  uint8_t rgb [12];
  string local_298;
  string *local_278;
  ulong local_270;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_268;
  undefined8 local_260;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_258;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_248;
  undefined1 local_240 [8];
  size_type local_238;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_230;
  int aiStack_220 [4];
  uint8_t *local_210;
  uint8_t *local_208;
  ios_base local_148 [268];
  uint8_t local_3c [12];
  
  paVar9 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar9;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (fmt == PNG) {
    anon_unknown_1::storeImagePNG((string *)local_240,name,image,yoffset,height);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_240);
    auVar11 = local_240;
    if (local_240 == (undefined1  [8])&local_230) {
      return __return_storage_ptr__;
    }
    goto LAB_00124150;
  }
  uVar1 = image->height;
  if (height == 0) {
    height = uVar1;
  }
  _Var2._M_head_impl =
       (image->pixel)._M_t.
       super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
       super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
       super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
  local_270 = yoffset;
  if (uVar1 < yoffset) {
    local_270 = uVar1;
  }
  height_00 = uVar1 - local_270;
  if (height <= uVar1 - local_270) {
    height_00 = height;
  }
  uVar1 = image->width;
  sVar14 = image->xpadding;
  pixelformat = image->pixelformat;
  local_268 = &local_258;
  local_260 = 0;
  local_258._M_local_buf[0] = '\0';
  local_278 = __return_storage_ptr__;
  local_248 = paVar9;
  if ((long)pixelformat < 0x20c005a) {
    if ((long)pixelformat < 0x1100007) {
      if ((pixelformat != 0x1080001) && (pixelformat != 0x10800c6)) goto LAB_00124931;
LAB_0012448b:
      pcVar3 = (name->_M_dataplus)._M_p;
      local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_298,pcVar3,pcVar3 + name->_M_string_length);
      std::__cxx11::string::append((char *)&local_298);
      ensureNewFileName((string *)local_240,&local_298);
      std::__cxx11::string::operator=((string *)&local_268,(string *)local_240);
      if (local_240 != (undefined1  [8])&local_230) {
        operator_delete((void *)local_240);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != &local_298.field_2) {
        operator_delete(local_298._M_dataplus._M_p);
      }
      std::ofstream::ofstream(local_240,(string *)&local_268,_S_bin);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,"P5",2);
      std::ios::widen((char)(ostream *)local_240 + (char)*(undefined8 *)((long)local_240 + -0x18));
      std::ostream::put((char)local_240);
      std::ostream::flush();
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)local_240);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)local_240,0xff);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
      if (height_00 != 0) {
        puVar6 = _Var2._M_head_impl + (sVar14 + uVar1) * local_270;
        sVar13 = 0;
        do {
          uVar5 = uVar1;
          if (*(int *)((long)aiStack_220 + *(long *)((long)local_240 + -0x18)) != 0) break;
          for (; uVar5 != 0; uVar5 = uVar5 - 1) {
            if (local_210 < local_208) {
              *local_210 = *puVar6;
              local_210 = local_210 + 1;
            }
            else {
              (**(code **)(local_238 + 0x68))((filebuf *)&local_238,*puVar6);
            }
            puVar6 = puVar6 + 1;
          }
          puVar6 = puVar6 + sVar14;
          sVar13 = sVar13 + 1;
        } while (sVar13 != height_00);
      }
      std::ofstream::close();
      local_240 = (undefined1  [8])_VTT;
      *(undefined8 *)(local_240 + *(long *)(_VTT->_M_local_buf + -0x18)) = _png_destroy_write_struct
      ;
      std::filebuf::~filebuf((filebuf *)&local_238);
    }
    else {
      if ((pixelformat != 0x1100007) && (pixelformat != 0x11000b8)) goto LAB_00124931;
      pcVar3 = (name->_M_dataplus)._M_p;
      local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_298,pcVar3,pcVar3 + name->_M_string_length);
      std::__cxx11::string::append((char *)&local_298);
      ensureNewFileName((string *)local_240,&local_298);
      std::__cxx11::string::operator=((string *)&local_268,(string *)local_240);
      if (local_240 != (undefined1  [8])&local_230) {
        operator_delete((void *)local_240);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != &local_298.field_2) {
        operator_delete(local_298._M_dataplus._M_p);
      }
      std::ofstream::ofstream(local_240,(string *)&local_268,_S_bin);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,"P5",2);
      std::ios::widen((char)(ostream *)local_240 + (char)*(undefined8 *)((long)local_240 + -0x18));
      std::ostream::put((char)local_240);
      std::ostream::flush();
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)local_240);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)local_240,0xffff);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
      puVar6 = _Var2._M_head_impl + (sVar14 + uVar1 * 2) * local_270;
      if (image->bigendian == false) {
        if (height_00 != 0) {
          sVar13 = 0;
          do {
            uVar5 = uVar1;
            if (*(int *)((long)aiStack_220 + *(long *)((long)local_240 + -0x18)) != 0) break;
            for (; uVar5 != 0; uVar5 = uVar5 - 1) {
              if (local_210 < local_208) {
                *local_210 = puVar6[1];
                local_210 = local_210 + 1;
              }
              else {
                (**(code **)(local_238 + 0x68))(&local_238,puVar6[1]);
              }
              if (local_210 < local_208) {
                *local_210 = *puVar6;
                local_210 = local_210 + 1;
              }
              else {
                (**(code **)(local_238 + 0x68))(&local_238,*puVar6);
              }
              puVar6 = puVar6 + 2;
            }
            puVar6 = puVar6 + sVar14;
            sVar13 = sVar13 + 1;
          } while (sVar13 != height_00);
        }
      }
      else if (height_00 != 0) {
        sVar13 = 0;
        do {
          uVar5 = uVar1;
          if (*(int *)((long)aiStack_220 + *(long *)((long)local_240 + -0x18)) != 0) break;
          for (; uVar5 != 0; uVar5 = uVar5 - 1) {
            if (local_210 < local_208) {
              *local_210 = *puVar6;
              local_210 = local_210 + 1;
            }
            else {
              (**(code **)(local_238 + 0x68))(&local_238,*puVar6);
            }
            if (local_210 < local_208) {
              *local_210 = puVar6[1];
              local_210 = local_210 + 1;
            }
            else {
              (**(code **)(local_238 + 0x68))(&local_238,puVar6[1]);
            }
            puVar6 = puVar6 + 2;
          }
          puVar6 = puVar6 + sVar14;
          sVar13 = sVar13 + 1;
        } while (sVar13 != height_00);
      }
      std::ofstream::close();
      local_240 = (undefined1  [8])_VTT;
      *(undefined8 *)(local_240 + *(long *)(_VTT->_M_local_buf + -0x18)) = _png_destroy_write_struct
      ;
LAB_00124d11:
      std::filebuf::~filebuf((filebuf *)&local_238);
    }
    std::ios_base::~ios_base(local_148);
  }
  else {
    if ((long)pixelformat < 0x210003b) {
      if ((pixelformat == 0x20c005a) || (pixelformat == 0x2100032)) {
LAB_001246a3:
        pcVar3 = (name->_M_dataplus)._M_p;
        local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_298,pcVar3,pcVar3 + name->_M_string_length);
        std::__cxx11::string::append((char *)&local_298);
        ensureNewFileName((string *)local_240,&local_298);
        std::__cxx11::string::operator=((string *)&local_268,(string *)local_240);
        if (local_240 != (undefined1  [8])&local_230) {
          operator_delete((void *)local_240);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_dataplus._M_p != &local_298.field_2) {
          operator_delete(local_298._M_dataplus._M_p);
        }
        std::ofstream::ofstream(local_240,(string *)&local_268,_S_bin);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,"P6",2);
        std::ios::widen((char)(ostream *)local_240 + (char)*(undefined8 *)((long)local_240 + -0x18))
        ;
        std::ostream::put((char)local_240);
        std::ostream::flush();
        poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)local_240);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
        poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        poVar7 = (ostream *)std::ostream::operator<<((ostream *)local_240,0xff);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
        if (pixelformat == 0x20c005a) {
          uVar5 = (uVar1 >> 1 & 0xfffffffffffffffe) * 3;
        }
        else {
          uVar5 = uVar1 * 2 & 0xfffffffffffffff8;
        }
        if (height_00 != 0) {
          puVar6 = _Var2._M_head_impl + local_270 * (uVar5 + sVar14);
          sVar13 = 0;
          do {
            if (*(int *)((long)aiStack_220 + *(long *)((long)local_240 + -0x18)) != 0) break;
            if (uVar1 != 0) {
              uVar10 = 0;
              do {
                if (pixelformat == 0x20c005a) {
                  convYCbCr411toQuadRGB(local_3c,puVar6,(int)uVar10);
                }
                else {
                  convYCbCr422toQuadRGB(local_3c,puVar6,(int)uVar10);
                }
                lVar15 = 0;
                do {
                  if (local_210 < local_208) {
                    *local_210 = local_3c[lVar15];
                    local_210 = local_210 + 1;
                  }
                  else {
                    (**(code **)(local_238 + 0x68))(&local_238,local_3c[lVar15]);
                  }
                  lVar15 = lVar15 + 1;
                } while (lVar15 != 0xc);
                uVar10 = uVar10 + 4;
              } while (uVar10 < uVar1);
            }
            puVar6 = puVar6 + uVar5 + sVar14;
            sVar13 = sVar13 + 1;
          } while (sVar13 != height_00);
        }
        std::ofstream::close();
        local_240 = (undefined1  [8])_VTT;
        *(undefined8 *)(local_240 + *(long *)(_VTT->_M_local_buf + -0x18)) =
             _png_destroy_write_struct;
        goto LAB_00124d11;
      }
    }
    else {
      if (pixelformat == 0x210003b) goto LAB_001246a3;
      if (pixelformat == 0x81080001) goto LAB_0012448b;
    }
LAB_00124931:
    puVar6 = (uint8_t *)operator_new__(height_00 * uVar1 * 3);
    uVar5 = uVar1 * 3;
    if (pixelformat != 0x2180014) {
      uVar5 = uVar1;
    }
    bVar4 = convertImage(puVar6,(uint8_t *)0x0,_Var2._M_head_impl + (uVar5 + sVar14) * local_270,
                         pixelformat,uVar1,height_00,sVar14);
    if (!bVar4) {
      this = (IOException *)__cxa_allocate_exception(0x28);
      local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_298,"storeImage(): Unsupported pixel format: ","");
      GetPixelFormatName((PfncFormat)image->pixelformat);
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_298);
      local_240 = (undefined1  [8])*plVar8;
      paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(plVar8 + 2);
      if (local_240 == (undefined1  [8])paVar9) {
        local_230._M_allocated_capacity = paVar9->_M_allocated_capacity;
        local_230._8_8_ = plVar8[3];
        local_240 = (undefined1  [8])&local_230;
      }
      else {
        local_230._M_allocated_capacity = paVar9->_M_allocated_capacity;
      }
      local_238 = plVar8[1];
      *plVar8 = (long)paVar9;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      anon_unknown_1::IOException::IOException(this,(string *)local_240);
      __cxa_throw(this,&(anonymous_namespace)::IOException::typeinfo,
                  anon_unknown_1::IOException::~IOException);
    }
    pcVar3 = (name->_M_dataplus)._M_p;
    local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_298,pcVar3,pcVar3 + name->_M_string_length);
    std::__cxx11::string::append((char *)&local_298);
    ensureNewFileName((string *)local_240,&local_298);
    std::__cxx11::string::operator=((string *)&local_268,(string *)local_240);
    if (local_240 != (undefined1  [8])&local_230) {
      operator_delete((void *)local_240);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != &local_298.field_2) {
      operator_delete(local_298._M_dataplus._M_p);
    }
    std::ofstream::ofstream(local_240,(string *)&local_268,_S_bin);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,"P6",2);
    std::ios::widen((char)(ostream *)local_240 + (char)*(undefined8 *)((long)local_240 + -0x18));
    std::ostream::put((char)local_240);
    std::ostream::flush();
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)local_240);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)local_240,0xff);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
    if (height_00 != 0) {
      sVar14 = 0;
      puVar12 = puVar6;
      do {
        uVar5 = uVar1;
        if (*(int *)((long)aiStack_220 + *(long *)((long)local_240 + -0x18)) != 0) break;
        for (; uVar5 != 0; uVar5 = uVar5 - 1) {
          if (local_210 < local_208) {
            *local_210 = *puVar12;
            local_210 = local_210 + 1;
          }
          else {
            (**(code **)(local_238 + 0x68))((filebuf *)&local_238,*puVar12);
          }
          if (local_210 < local_208) {
            *local_210 = puVar12[1];
            local_210 = local_210 + 1;
          }
          else {
            (**(code **)(local_238 + 0x68))((filebuf *)&local_238,puVar12[1]);
          }
          if (local_210 < local_208) {
            *local_210 = puVar12[2];
            local_210 = local_210 + 1;
          }
          else {
            (**(code **)(local_238 + 0x68))((filebuf *)&local_238,puVar12[2]);
          }
          puVar12 = puVar12 + 3;
        }
        sVar14 = sVar14 + 1;
      } while (sVar14 != height_00);
    }
    std::ofstream::close();
    local_240 = (undefined1  [8])_VTT;
    *(undefined8 *)(local_240 + *(long *)(_VTT->_M_local_buf + -0x18)) = _png_destroy_write_struct;
    std::filebuf::~filebuf((filebuf *)&local_238);
    std::ios_base::~ios_base(local_148);
    operator_delete__(puVar6);
  }
  __return_storage_ptr__ = local_278;
  std::__cxx11::string::operator=((string *)local_278,(string *)&local_268);
  auVar11 = (undefined1  [8])local_268;
  if (local_268 == &local_258) {
    return __return_storage_ptr__;
  }
LAB_00124150:
  operator_delete((void *)auVar11);
  return __return_storage_ptr__;
}

Assistant:

std::string storeImage(const std::string &name, ImgFmt fmt, const Image &image,
  size_t yoffset, size_t height)
{
  std::string ret;

  switch (fmt)
  {
    case PNG:
#ifdef INCLUDE_PNG
      ret=storeImagePNG(name, image, yoffset, height);
#else
      throw IOException("storeImage(): Support for PNG image file format is not compiled in!");
#endif
      break;

    default:
    case PNM:
      ret=storeImagePNM(name, image, yoffset, height);
      break;
  }

  return ret;
}